

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::anon_unknown_135::initialize_piece_info
          (anon_unknown_135 *this,piece_picker *p,torrent_info *ti,int block_size,
          vector<libtorrent::block_info,_std::allocator<libtorrent::block_info>_> *blk,
          span<const_libtorrent::aux::piece_picker::downloading_piece> q,
          vector<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
          *queue)

{
  uint uVar1;
  torrent_peer *this_00;
  peer_connection_interface *ppVar2;
  iterator __position;
  piece_picker *this_01;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  block_info *pbVar6;
  undefined4 extraout_var;
  uint extraout_var_00;
  uint uVar7;
  undefined4 in_register_0000000c;
  ushort extraout_DX;
  uint uVar8;
  peer_connection_interface *ppVar9;
  long lVar10;
  block_info *this_02;
  short sVar11;
  ulong uVar12;
  long lVar13;
  span<const_libtorrent::aux::piece_picker::block_info> sVar14;
  partial_piece_info pi;
  long local_e0;
  partial_piece_info local_c0;
  long local_a0;
  long local_98;
  downloading_piece *local_90;
  piece_picker *local_88;
  piece_picker *local_80;
  long *local_78;
  undefined1 local_70 [36];
  basic_endpoint<boost::asio::ip::tcp> local_4c;
  
  local_78 = (long *)CONCAT44(in_register_0000000c,block_size);
  local_88 = (piece_picker *)this;
  local_80 = p;
  iVar4 = piece_picker::blocks_in_piece((piece_picker *)this,(piece_index_t)0x0);
  if (queue != (vector<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
                *)0x0) {
    local_90 = (downloading_piece *)
               ((long)&(blk->
                       super__Vector_base<libtorrent::block_info,_std::allocator<libtorrent::block_info>_>
                       )._M_impl.super__Vector_impl_data._M_start + (long)queue * 0xc);
    local_98 = (long)iVar4;
    local_a0 = local_98 * 0x18;
    local_e0 = 0;
    lVar13 = 0;
    do {
      this_01 = local_88;
      local_c0.blocks_in_piece =
           piece_picker::blocks_in_piece
                     (local_88,(piece_index_t)(((downloading_piece *)blk)->index).m_val);
      local_c0.finished = *(uint *)&((downloading_piece *)blk)->field_0x6 & 0x7fff;
      local_c0.writing = *(uint *)&((downloading_piece *)blk)->field_0x6 >> 0x10 & 0x7fff;
      local_c0.requested = *(ushort *)&((downloading_piece *)blk)->field_0xa & 0x7fff;
      lVar10 = *local_78;
      local_c0.blocks = (block_info *)(lVar13 * local_98 * 0x18 + lVar10);
      uVar5 = file_storage::piece_size
                        ((file_storage *)local_80,
                         (piece_index_t)(((downloading_piece *)blk)->index).m_val);
      sVar14 = piece_picker::blocks_for_piece(this_01,(downloading_piece *)blk);
      pbVar6 = sVar14.m_ptr;
      if (sVar14.m_len != 0) {
        this_02 = (block_info *)(lVar10 + local_e0);
        lVar10 = 0;
        uVar12 = 0;
        do {
          uVar1 = *(uint *)(&pbVar6->field_0x8 + lVar10);
          uVar8 = (*(uint *)&this_02->field_0x14 & 0xfffe7fff) + (uVar1 & 0xc000) * 2;
          *(uint *)&this_02->field_0x14 = uVar8;
          uVar7 = uVar5;
          if ((long)uVar12 < (long)local_c0.blocks_in_piece + -1) {
            uVar7 = (uint)ti;
          }
          *(uint *)&this_02->field_0x14 = uVar8 & 0xffff8000 | uVar7 & 0x7fff;
          this_00 = *(torrent_peer **)((long)&pbVar6->peer + lVar10);
          sVar11 = (short)uVar1;
          if (this_00 == (torrent_peer *)0x0) {
            local_70[8] = '\0';
            local_70[9] = '\0';
            local_70[10] = '\0';
            local_70[0xb] = '\0';
            local_70[0xc] = '\0';
            local_70[0xd] = '\0';
            local_70[0xe] = '\0';
            local_70[0xf] = '\0';
            local_70._16_8_ = 0;
            local_70._24_4_ = 0;
            local_70._0_8_ = 2;
            block_info::set_peer(this_02,(endpoint *)local_70);
            if (sVar11 < 0) {
              uVar3 = *(ushort *)&this_02->field_0x14 & 0x7fff;
            }
            else {
              uVar3 = 0;
            }
            *(ushort *)&this_02->field_0x12 = uVar3 | *(ushort *)&this_02->field_0x12 & 0x8000;
          }
          else {
            ppVar2 = this_00->connection;
            if (ppVar2 == (peer_connection_interface *)0x0) {
              torrent_peer::address(this_00);
              boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
                        (&local_4c,(address *)local_70,this_00->port);
              block_info::set_peer(this_02,&local_4c);
              if (sVar11 < 0) {
                uVar3 = *(ushort *)&this_02->field_0x14 & 0x7fff;
              }
              else {
                uVar3 = 0;
              }
              *(ushort *)&this_02->field_0x12 = uVar3 | *(ushort *)&this_02->field_0x12 & 0x8000;
            }
            else {
              ppVar9 = ppVar2 + -0x10;
              iVar4 = (*ppVar2[-0x10]._vptr_peer_connection_interface[0x10])(ppVar9);
              block_info::set_peer(this_02,(endpoint *)CONCAT44(extraout_var,iVar4));
              if ((*(uint *)&this_02->field_0x14 & 0x18000) == 0x8000) {
                iVar4 = (*ppVar9->_vptr_peer_connection_interface[0x1c])(ppVar9);
                if (uVar12 == extraout_var_00 && (((downloading_piece *)blk)->index).m_val == iVar4)
                {
                  *(ushort *)&this_02->field_0x12 =
                       *(ushort *)&this_02->field_0x12 & 0x8000 | extraout_DX & 0x7fff;
                }
                else {
                  *(ushort *)&this_02->field_0x12 = *(ushort *)&this_02->field_0x12 & 0x8000;
                }
              }
              else {
                *(ushort *)&this_02->field_0x12 =
                     *(ushort *)&this_02->field_0x12 & 0x8000 |
                     (ushort)*(uint *)&this_02->field_0x14 & sVar11 >> 0xf & 0x7fff;
              }
            }
          }
          *(uint *)&this_02->field_0x14 =
               *(uint *)&this_02->field_0x14 & 0x8001ffff |
               (*(ushort *)(&pbVar6->field_0x8 + lVar10) & 0x3fff) << 0x11;
          uVar5 = uVar5 - (uint)ti;
          uVar12 = uVar12 + 1;
          this_02 = this_02 + 1;
          lVar10 = lVar10 + 0x10;
        } while (sVar14.m_len << 4 != lVar10);
      }
      local_c0.piece_index.m_val = (((downloading_piece *)blk)->index).m_val;
      __position._M_current = *(partial_piece_info **)&(q.m_ptr)->field_0x8;
      if (__position._M_current == *(partial_piece_info **)&q.m_ptr[1].info_idx) {
        ::std::vector<libtorrent::partial_piece_info,std::allocator<libtorrent::partial_piece_info>>
        ::_M_realloc_insert<libtorrent::partial_piece_info_const&>
                  ((vector<libtorrent::partial_piece_info,std::allocator<libtorrent::partial_piece_info>>
                    *)q.m_ptr,__position,&local_c0);
      }
      else {
        *(ulong *)&(__position._M_current)->requested = CONCAT44(local_c0._20_4_,local_c0.requested)
        ;
        (__position._M_current)->blocks = local_c0.blocks;
        (__position._M_current)->piece_index = (piece_index_t)local_c0.piece_index.m_val;
        (__position._M_current)->blocks_in_piece = local_c0.blocks_in_piece;
        (__position._M_current)->finished = local_c0.finished;
        (__position._M_current)->writing = local_c0.writing;
        *(long *)&(q.m_ptr)->field_0x8 = *(long *)&(q.m_ptr)->field_0x8 + 0x20;
      }
      blk = (vector<libtorrent::block_info,_std::allocator<libtorrent::block_info>_> *)
            ((long)blk + 0xc);
      lVar13 = lVar13 + 1;
      local_e0 = local_e0 + local_a0;
    } while ((downloading_piece *)blk != local_90);
  }
  return;
}

Assistant:

void initialize_piece_info(piece_picker const& p
		, torrent_info const& ti
		, int const block_size
		, std::vector<block_info>& blk
		, span<piece_picker::downloading_piece const> q
		, std::vector<partial_piece_info>* queue)
	{
		const int blocks_per_piece = p.blocks_in_piece(piece_index_t(0));
		int counter = 0;
		for (auto i = q.begin(); i != q.end(); ++i, ++counter)
		{
			partial_piece_info pi;
			pi.blocks_in_piece = p.blocks_in_piece(i->index);
			pi.finished = int(i->finished);
			pi.writing = int(i->writing);
			pi.requested = int(i->requested);
#if TORRENT_ABI_VERSION == 1
			pi.piece_state = partial_piece_info::none;
#endif
			TORRENT_ASSERT(counter * blocks_per_piece + pi.blocks_in_piece <= int(blk.size()));
			block_info* blocks = &blk[std::size_t(counter * blocks_per_piece)];
			pi.blocks = blocks;
			int const piece_size = ti.piece_size(i->index);
			int idx = -1;
			for (auto const& info : p.blocks_for_piece(*i))
			{
				++idx;
				block_info& bi = blocks[idx];
				bi.state = info.state;
				bi.block_size = idx < pi.blocks_in_piece - 1
					? aux::numeric_cast<std::uint32_t>(block_size)
					: aux::numeric_cast<std::uint32_t>(piece_size - (idx * block_size));
				bool const complete = bi.state == block_info::writing
					|| bi.state == block_info::finished;
				if (info.peer == nullptr)
				{
					bi.set_peer(tcp::endpoint());
					bi.bytes_progress = complete ? bi.block_size : 0;
				}
				else
				{
					torrent_peer* tp = info.peer;
					TORRENT_ASSERT(tp->in_use);
					if (tp->connection)
					{
						auto* peer = static_cast<peer_connection*>(tp->connection);
						TORRENT_ASSERT(peer->m_in_use);
						bi.set_peer(peer->remote());
						if (bi.state == block_info::requested)
						{
							auto pbp = peer->downloading_piece_progress();
							if (pbp.piece_index == i->index && pbp.block_index == idx)
							{
								bi.bytes_progress = aux::numeric_cast<std::uint32_t>(pbp.bytes_downloaded);
								TORRENT_ASSERT(bi.bytes_progress <= bi.block_size);
							}
							else
							{
								bi.bytes_progress = 0;
							}
						}
						else
						{
							bi.bytes_progress = complete ? bi.block_size : 0;
						}
					}
					else
					{
						bi.set_peer(tp->ip());
						bi.bytes_progress = complete ? bi.block_size : 0;
					}
				}

				bi.num_peers = info.num_peers;
			}
			pi.piece_index = i->index;
			queue->push_back(pi);
		}
	}